

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O1

Spectrum __thiscall
CMU462::StaticScene::PointLight::sample_L
          (PointLight *this,Vector3D *p,Vector3D *wi,float *distToLight,float *pdf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double __x;
  double dVar5;
  
  dVar2 = (this->position).x - p->x;
  dVar3 = (this->position).y - p->y;
  dVar4 = (this->position).z - p->z;
  __x = dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3;
  dVar5 = SQRT(__x);
  dVar1 = dVar5;
  if (__x < 0.0) {
    dVar1 = sqrt(__x);
  }
  dVar1 = 1.0 / dVar1;
  wi->x = dVar2 * dVar1;
  wi->y = dVar3 * dVar1;
  wi->z = dVar4 * dVar1;
  if (__x < 0.0) {
    dVar5 = sqrt(__x);
  }
  *distToLight = (float)dVar5;
  *pdf = 1.0;
  return this->radiance;
}

Assistant:

Spectrum PointLight::sample_L(const Vector3D& p, Vector3D* wi,
                             float* distToLight,
                             float* pdf) const {
  Vector3D d = position - p;
  *wi = d.unit();
  *distToLight = d.norm();
  *pdf = 1.0;
  return radiance;
}